

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O3

VariableStruct * __thiscall
adios2::core::IO::InquireStructVariable
          (IO *this,string *name,StructDefinition *def,bool allowReorganize)

{
  _Alloc_hider _Var1;
  int iVar2;
  DataType DVar3;
  DataType DVar4;
  VariableStruct *pVVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  bool bVar9;
  string local_70;
  string local_50;
  
  pVVar5 = InquireStructVariable(this,name);
  if (pVVar5 != (VariableStruct *)0x0) {
    sVar6 = StructDefinition::Fields(pVVar5->m_WriteStructDefinition);
    sVar7 = StructDefinition::Fields(def);
    if (sVar6 == sVar7) {
      sVar6 = StructDefinition::Fields(def);
      if (sVar6 == 0) {
        return pVVar5;
      }
      sVar6 = 0;
      while( true ) {
        StructDefinition::Name_abi_cxx11_(&local_50,pVVar5->m_WriteStructDefinition,sVar6);
        StructDefinition::Name_abi_cxx11_(&local_70,def,sVar6);
        _Var1._M_p = local_70._M_dataplus._M_p;
        if (local_50._M_string_length == local_70._M_string_length) {
          if (local_50._M_string_length == 0) {
            bVar9 = false;
          }
          else {
            iVar2 = bcmp(local_50._M_dataplus._M_p,local_70._M_dataplus._M_p,
                         local_50._M_string_length);
            bVar9 = iVar2 != 0;
          }
        }
        else {
          bVar9 = true;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var1._M_p != &local_70.field_2) {
          operator_delete(_Var1._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (bVar9) break;
        sVar7 = StructDefinition::Offset(pVVar5->m_WriteStructDefinition,sVar6);
        sVar8 = StructDefinition::Offset(def,sVar6);
        if (sVar7 != sVar8 && !allowReorganize) {
          return (VariableStruct *)0x0;
        }
        DVar3 = StructDefinition::Type(pVVar5->m_WriteStructDefinition,sVar6);
        DVar4 = StructDefinition::Type(def,sVar6);
        if (DVar3 != DVar4) {
          return (VariableStruct *)0x0;
        }
        sVar7 = StructDefinition::ElementCount(pVVar5->m_WriteStructDefinition,sVar6);
        sVar8 = StructDefinition::ElementCount(def,sVar6);
        if (sVar7 != sVar8) {
          return (VariableStruct *)0x0;
        }
        sVar6 = sVar6 + 1;
        sVar7 = StructDefinition::Fields(def);
        if (sVar7 <= sVar6) {
          return pVVar5;
        }
      }
    }
  }
  return (VariableStruct *)0x0;
}

Assistant:

VariableStruct *IO::InquireStructVariable(const std::string &name, const StructDefinition &def,
                                          const bool allowReorganize) noexcept
{
    auto ret = InquireStructVariable(name);
    if (ret == nullptr)
    {
        return nullptr;
    }

    if (ret->m_WriteStructDefinition->Fields() != def.Fields())
    {
        return nullptr;
    }

    for (size_t i = 0; i < def.Fields(); ++i)
    {
        if (ret->m_WriteStructDefinition->Name(i) != def.Name(i))
        {
            return nullptr;
        }
        if (ret->m_WriteStructDefinition->Offset(i) != def.Offset(i) && !allowReorganize)
        {
            return nullptr;
        }
        if (ret->m_WriteStructDefinition->Type(i) != def.Type(i))
        {
            return nullptr;
        }
        if (ret->m_WriteStructDefinition->ElementCount(i) != def.ElementCount(i))
        {
            return nullptr;
        }
    }

    return ret;
}